

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_arms_light(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  AFFECT_DATA local_80;
  
  ch_00 = ch->fighting;
  if (ch_00 != (CHAR_DATA *)0x0) {
    bVar1 = is_affected_obj(obj,(int)gsn_arms_of_light);
    if (bVar1) {
      iVar2 = number_percent();
      if (0x5a < iVar2) {
        act("$p suddenly flares brightly!",ch_00,obj,(void *)0x0,0);
        bVar1 = saves_spell((int)ch->level,ch_00,0xf);
        if (!bVar1) {
          act("$n appears to be blinded.",ch_00,obj,(void *)0x0,0);
          act("You are blinded!",ch,(void *)0x0,ch_00,2);
          init_affect(&local_80);
          local_80.where = 0;
          local_80.aftype = 1;
          local_80.type = gsn_blindness;
          local_80.duration = ch->level / 0xc;
          local_80.location = 0x12;
          local_80.modifier = -4;
          local_80.bitvector[0]._0_1_ = (byte)local_80.bitvector[0] | 1;
          affect_to_char(ch_00,&local_80);
        }
      }
    }
  }
  return;
}

Assistant:

void fight_prog_arms_light(OBJ_DATA *obj, CHAR_DATA *ch)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = ch->fighting;

	if (!victim)
		return;

	if (!is_affected_obj(obj, gsn_arms_of_light))
		return;

	if (number_percent() > 90)
	{
		act("$p suddenly flares brightly!", victim, obj, 0, TO_ROOM);

		if (!saves_spell(ch->level, victim, DAM_LIGHT))
		{
			act("$n appears to be blinded.", victim, obj, 0, TO_ROOM);
			act("You are blinded!", ch, 0, victim, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.type = gsn_blindness;
			af.duration = ch->level / 12;
			af.modifier = -4;
			af.location = APPLY_HITROLL;
			SET_BIT(af.bitvector, AFF_BLIND);
			affect_to_char(victim, &af);
		}
	}
}